

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

QAbstractItemModel * __thiscall
tst_SerialiserCommon::createStringModel(tst_SerialiserCommon *this,QObject *parent)

{
  result_type_conflict rVar1;
  QStringListModel *this_00;
  QString local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QString local_a0;
  QString local_88;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  QStringList itmesList;
  uniform_int_distribution<int> itemsDist;
  uniform_int_distribution<int> rowsDist;
  QObject *parent_local;
  tst_SerialiserCommon *this_local;
  char16_t *str;
  
  std::uniform_int_distribution<int>::uniform_int_distribution(&itemsDist,0x14,0x32);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&itmesList.d.size,0,1000);
  QList<QString>::QList((QList<QString> *)local_58);
  for (local_5c = std::uniform_int_distribution<int>::operator()(&itemsDist,&this->generator);
      0 < local_5c; local_5c = local_5c + -1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b8,(Data *)0x0,L"Item ",5);
    QString::QString(&local_a0,&local_b8);
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&itmesList.d.size,&this->generator);
    QString::number((int)&local_d0,rVar1);
    operator+(&local_88,&local_a0,&local_d0);
    QList<QString>::append((QList<QString> *)local_58,&local_88);
    QString::~QString(&local_88);
    QString::~QString(&local_d0);
    QString::~QString(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,(QList_conflict *)local_58,parent);
  QList<QString>::~QList((QList<QString> *)local_58);
  return (QAbstractItemModel *)this_00;
}

Assistant:

QAbstractItemModel *tst_SerialiserCommon::createStringModel(QObject *parent)
{
    std::uniform_int_distribution<int> rowsDist(20, 50);
    std::uniform_int_distribution<int> itemsDist(0, 1000);

    QStringList itmesList;
    for (int i = rowsDist(generator); i > 0; --i)
        itmesList.append(QStringLiteral("Item ") + QString::number(itemsDist(generator)));
    return new QStringListModel(itmesList, parent);
}